

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::PushOverrideID(ImGuiID id)

{
  ImGuiID in_EDI;
  ImGuiWindow *window;
  ImGuiContext *g;
  void *in_stack_00000080;
  void *in_stack_00000088;
  ImGuiDataType in_stack_00000090;
  ImGuiID in_stack_00000094;
  ImGuiWindow *v;
  ImGuiContext *this;
  
  v = GImGui->CurrentWindow;
  this = GImGui;
  if (GImGui->DebugHookIdInfo == in_EDI) {
    DebugHookIdInfo(in_stack_00000094,in_stack_00000090,in_stack_00000088,in_stack_00000080);
  }
  ImVector<unsigned_int>::push_back((ImVector<unsigned_int> *)this,(uint *)v);
  return;
}

Assistant:

void ImGui::PushOverrideID(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
#ifndef IMGUI_DISABLE_DEBUG_TOOLS
    if (g.DebugHookIdInfo == id)
        DebugHookIdInfo(id, ImGuiDataType_ID, NULL, NULL);
#endif
    window->IDStack.push_back(id);
}